

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition_variable.hpp
# Opt level: O0

__pid_t __thiscall zmq::condition_variable_t::wait(condition_variable_t *this,void *__stat_loc)

{
  cv_status cVar1;
  int *piVar2;
  int in_EDX;
  int res;
  mutex_t *in_stack_00000028;
  condition_variable_any *in_stack_00000030;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffffe0;
  __pid_t _Var3;
  
  _Var3 = 0;
  if (in_EDX == -1) {
    std::_V2::condition_variable_any::wait<zmq::mutex_t>(in_stack_00000030,in_stack_00000028);
  }
  else {
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&stack0xffffffffffffffe0,
               (int *)&stack0xffffffffffffffec);
    cVar1 = std::_V2::condition_variable_any::wait_for<zmq::mutex_t,long,std::ratio<1l,1000l>>
                      ((condition_variable_any *)__stat_loc,(mutex_t *)CONCAT44(in_EDX,_Var3),
                       in_stack_ffffffffffffffe0);
    if (cVar1 == timeout) {
      piVar2 = __errno_location();
      *piVar2 = 0xb;
      _Var3 = -1;
    }
  }
  return _Var3;
}

Assistant:

int wait (mutex_t *mutex_, int timeout_)
    {
        // this assumes that the mutex mutex_ has been locked by the caller
        int res = 0;
        if (timeout_ == -1) {
            _cv.wait (
              *mutex_); // unlock mtx and wait cv.notify_all(), lock mtx after cv.notify_all()
        } else if (_cv.wait_for (*mutex_, std::chrono::milliseconds (timeout_))
                   == std::cv_status::timeout) {
            // time expired
            errno = EAGAIN;
            res = -1;
        }
        return res;
    }